

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O0

void __thiscall DatabaseSnapshot::compact_locked_datasets(DatabaseSnapshot *this,Task *task)

{
  bool bVar1;
  TaskSpec *this_00;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *this_01;
  const_iterator this_02;
  const_iterator name;
  add_pointer_t<const_DatasetLock> this_03;
  string *__x;
  runtime_error *this_04;
  Task *in_RSI;
  OnDiskDataset *ds;
  DatasetLock *dslock;
  variant<DatasetLock,_IteratorLock> *lock;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  *__range1;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> datasets;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_stack_00000220;
  Task *in_stack_00000228;
  DatabaseSnapshot *in_stack_00000230;
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  *in_stack_ffffffffffffff68;
  OnDiskDataset *in_stack_ffffffffffffff70;
  
  std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::vector
            ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)0x196c9e);
  this_00 = Task::spec(in_RSI);
  this_01 = (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
            TaskSpec::locks(this_00);
  this_02 = std::
            vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
            ::begin(in_stack_ffffffffffffff68);
  name = std::
         vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
         ::end(in_stack_ffffffffffffff68);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::variant<DatasetLock,_IteratorLock>_*,_std::vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<const_std::variant<DatasetLock,_IteratorLock>_*,_std::vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) {
      internal_compact(in_stack_00000230,in_stack_00000228,in_stack_00000220);
      std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~vector(this_01);
      return;
    }
    __gnu_cxx::
    __normal_iterator<const_std::variant<DatasetLock,_IteratorLock>_*,_std::vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>_>
    ::operator*((__normal_iterator<const_std::variant<DatasetLock,_IteratorLock>_*,_std::vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>_>
                 *)&stack0xffffffffffffffb8);
    this_03 = std::get_if<DatasetLock,DatasetLock,IteratorLock>
                        ((variant<DatasetLock,_IteratorLock> *)0x196d1c);
    if (this_03 != (add_pointer_t<const_DatasetLock>)0x0) {
      __x = DatasetLock::target_abi_cxx11_(this_03);
      in_stack_ffffffffffffff70 =
           find_dataset((DatabaseSnapshot *)this_02._M_current,(string *)name._M_current);
      if (in_stack_ffffffffffffff70 == (OnDiskDataset *)0x0) {
        this_04 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_04,"Locked DS doesn\'t exist");
        __cxa_throw(this_04,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::push_back
                (this_01,(value_type *)__x);
    }
    __gnu_cxx::
    __normal_iterator<const_std::variant<DatasetLock,_IteratorLock>_*,_std::vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>_>
    ::operator++((__normal_iterator<const_std::variant<DatasetLock,_IteratorLock>_*,_std::vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>_>
                  *)&stack0xffffffffffffffb8);
  } while( true );
}

Assistant:

void DatabaseSnapshot::compact_locked_datasets(Task *task) const {
    std::vector<const OnDiskDataset *> datasets;
    for (const auto &lock : task->spec().locks()) {
        if (const auto *dslock = std::get_if<DatasetLock>(&lock)) {
            const OnDiskDataset *ds = find_dataset(dslock->target());
            if (ds == nullptr) {
                throw std::runtime_error("Locked DS doesn't exist");
            }
            datasets.push_back(ds);
        }
    }
    internal_compact(task, std::move(datasets));
}